

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool google::protobuf::TextFormat::PrintUnknownFieldsToString
               (UnknownFieldSet *unknown_fields,string *output)

{
  bool bVar1;
  Printer local_a8;
  
  Printer::Printer(&local_a8);
  bVar1 = Printer::PrintUnknownFieldsToString(&local_a8,unknown_fields,output);
  Printer::~Printer(&local_a8);
  return bVar1;
}

Assistant:

bool TextFormat::PrintUnknownFieldsToString(
    const UnknownFieldSet& unknown_fields, std::string* output) {
  return Printer().PrintUnknownFieldsToString(unknown_fields, output);
}